

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::~Player(Player *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  pointer pcVar3;
  
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_00126948;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->zoneNames);
  pBVar2 = (this->buildingUnitTiles).
           super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2,(long)(this->buildingUnitTiles).
                                 super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar2);
  }
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector(&this->gameTokens);
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&this->cards);
  MonsterCards::~MonsterCards(&(this->boardFigure).super_MonsterCards);
  MonsterCards::~MonsterCards(&this->monsterCard);
  pcVar3 = (this->playerName)._M_dataplus._M_p;
  paVar1 = &(this->playerName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Subject::~Subject(&this->super_Subject);
  return;
}

Assistant:

Player::~Player() {

}